

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

uint sum<unsigned_int>(vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                       *tensor)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  double dVar9;
  
  pvVar1 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(tensor->
                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    lVar5 = 0;
    uVar3 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar5].
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar6 = (long)*(pointer *)
                     ((long)&pvVar1[lVar5].
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar2;
      if (lVar6 != 0) {
        lVar6 = (lVar6 >> 3) * -0x5555555555555555;
        lVar7 = 0;
        do {
          dVar9 = 0.0;
          for (puVar8 = *(uint **)(lVar2 + lVar7 * 0x18);
              puVar8 != *(uint **)(lVar2 + 8 + lVar7 * 0x18); puVar8 = puVar8 + 1) {
            dVar9 = dVar9 + (double)*puVar8;
          }
          uVar3 = (ulong)((double)(uVar3 & 0xffffffff) + dVar9);
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar6 + (ulong)(lVar6 == 0));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4 + (ulong)(lVar4 == 0));
    return (uint)uVar3;
  }
  return 0;
}

Assistant:

T sum(std::vector<std::vector<std::vector<T> > > tensor){
    T result(0);
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            result += accumulate(tensor[i][j].begin(), tensor[i][j].end(), 0.0);
        }
    }
    return result;
}